

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void stream_obq_remove(nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_stream *local_18;
  nghttp2_stream *dep_stream;
  nghttp2_stream *stream_local;
  
  local_18 = stream->dep_prev;
  dep_stream = stream;
  if (stream->queued != '\0') {
    for (; local_18 != (nghttp2_stream *)0x0; local_18 = local_18->dep_prev) {
      nghttp2_pq_remove(&local_18->obq,&dep_stream->pq_entry);
      if (dep_stream->queued == '\0') {
        __assert_fail("stream->queued",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                      ,0xbf,"void stream_obq_remove(nghttp2_stream *)");
      }
      dep_stream->queued = '\0';
      dep_stream->cycle = 0;
      dep_stream->pending_penalty = 0;
      dep_stream->descendant_last_cycle = 0;
      dep_stream->last_writelen = 0;
      iVar1 = stream_subtree_active(local_18);
      if (iVar1 != 0) {
        return;
      }
      dep_stream = local_18;
    }
  }
  return;
}

Assistant:

static void stream_obq_remove(nghttp2_stream *stream) {
  nghttp2_stream *dep_stream;

  dep_stream = stream->dep_prev;

  if (!stream->queued) {
    return;
  }

  for (; dep_stream; stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    DEBUGF("stream: remove stream %d from stream %d\n", stream->stream_id,
           dep_stream->stream_id);

    nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

    assert(stream->queued);

    stream->queued = 0;
    stream->cycle = 0;
    stream->pending_penalty = 0;
    stream->descendant_last_cycle = 0;
    stream->last_writelen = 0;

    if (stream_subtree_active(dep_stream)) {
      return;
    }
  }
}